

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL WriteFile(HANDLE hFile,LPCVOID lpBuffer,DWORD nNumberOfBytesToWrite,
              LPDWORD lpNumberOfBytesWritten,LPOVERLAPPED lpOverlapped)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  CPalThread *pThread;
  PAL_ERROR palError;
  LPOVERLAPPED lpOverlapped_local;
  LPDWORD lpNumberOfBytesWritten_local;
  DWORD nNumberOfBytesToWrite_local;
  LPCVOID lpBuffer_local;
  HANDLE hFile_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalWriteFile
                          (pThread_00,hFile,lpBuffer,nNumberOfBytesToWrite,lpNumberOfBytesWritten,
                           lpOverlapped);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

BOOL
PALAPI
WriteFile(
      IN HANDLE hFile,
      IN LPCVOID lpBuffer,
      IN DWORD nNumberOfBytesToWrite,
      OUT LPDWORD lpNumberOfBytesWritten,
      IN LPOVERLAPPED lpOverlapped)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    
    PERF_ENTRY(WriteFile);
    ENTRY("WriteFile(hFile=%p, lpBuffer=%p, nToWrite=%u, lpWritten=%p, "
          "lpOverlapped=%p)\n", hFile, lpBuffer, nNumberOfBytesToWrite, 
          lpNumberOfBytesWritten, lpOverlapped);

    pThread = InternalGetCurrentThread();

    palError = InternalWriteFile(
        pThread,
        hFile,
        lpBuffer,
        nNumberOfBytesToWrite,
        lpNumberOfBytesWritten,
        lpOverlapped
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("WriteFile returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(WriteFile);
    return NO_ERROR == palError;
}